

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_ManSolve_rec(Tas_Man_t *p,int Level)

{
  Gia_Man_t *pGVar1;
  Tas_Man_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int local_50;
  int local_4c;
  int iJustTail;
  int iJustHead;
  int iPropHead;
  int hLearn1;
  int hLearn0;
  int hClause;
  Gia_Obj_t *pDecVar;
  Gia_Obj_t *pVar;
  Tas_Que_t *pQue;
  Tas_Man_t *pTStack_18;
  int Level_local;
  Tas_Man_t *p_local;
  
  pVar = (Gia_Obj_t *)&p->pClauses;
  _hLearn0 = (Gia_Obj_t *)0x0;
  pQue._4_4_ = Level;
  pTStack_18 = p;
  iVar2 = Tas_QueIsEmpty(&p->pProp);
  if (iVar2 != 0) {
    __assert_fail("!Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                  ,0x50c,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  hLearn1 = Tas_ManPropagate(pTStack_18,pQue._4_4_);
  if (hLearn1 == 0) {
    iVar2 = Tas_QueIsEmpty(&pTStack_18->pProp);
    if (iVar2 == 0) {
      __assert_fail("Tas_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                    ,0x513,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
    }
    iVar2 = Tas_QueIsEmpty(&pTStack_18->pJust);
    if (iVar2 == 0) {
      iVar2 = Abc_MaxInt((pTStack_18->Pars).nJustThis,
                         (pTStack_18->pJust).iTail - (pTStack_18->pJust).iHead);
      (pTStack_18->Pars).nJustThis = iVar2;
      iVar2 = Tas_ManCheckLimits(pTStack_18);
      if (iVar2 == 0) {
        iJustTail = (pTStack_18->pProp).iHead;
        Tas_QueStore(&pTStack_18->pJust,&local_4c,&local_50);
        if ((pTStack_18->Pars).fUseActive == 0) {
          if ((pTStack_18->Pars).fUseHighest == 0) {
            if ((pTStack_18->Pars).fUseLowest == 0) {
              if ((pTStack_18->Pars).fUseMaxFF == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                              ,0x527,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
              }
              pDecVar = Tas_ManDecideMaxFF(pTStack_18);
            }
            else {
              pDecVar = Tas_ManDecideLowest(pTStack_18);
            }
          }
          else {
            pDecVar = Tas_ManDecideHighest(pTStack_18);
          }
        }
        else {
          pDecVar = (Gia_Obj_t *)0x0;
          _hLearn0 = Tas_ManFindActive(pTStack_18);
        }
        if (pDecVar != (Gia_Obj_t *)0x0) {
          iVar2 = Tas_VarIsJust(pDecVar);
          if (iVar2 == 0) {
            __assert_fail("Tas_VarIsJust( pVar )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCTas.c"
                          ,0x52b,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
          }
          pGVar1 = pTStack_18->pAig;
          pGVar4 = Gia_ObjFanin0(pDecVar);
          iVar2 = Gia_ObjRefNum(pGVar1,pGVar4);
          pGVar1 = pTStack_18->pAig;
          pGVar4 = Gia_ObjFanin1(pDecVar);
          iVar3 = Gia_ObjRefNum(pGVar1,pGVar4);
          if (iVar3 < iVar2) {
            pGVar4 = Gia_ObjChild0(pDecVar);
            _hLearn0 = Gia_Not(pGVar4);
          }
          else {
            pGVar4 = Gia_ObjChild1(pDecVar);
            _hLearn0 = Gia_Not(pGVar4);
          }
        }
        Tas_ManAssign(pTStack_18,_hLearn0,pQue._4_4_ + 1,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        iPropHead = Tas_ManSolve_rec(pTStack_18,pQue._4_4_ + 1);
        if (iPropHead == 0) {
          p_local._4_4_ = 0;
        }
        else {
          pGVar4 = *(Gia_Obj_t **)(*(long *)&pVar[1].field_0x4 + (long)iPropHead * 8);
          pGVar5 = Gia_Regular(_hLearn0);
          if (pGVar4 == pGVar5) {
            Tas_ManCancelUntil(pTStack_18,iJustTail);
            Tas_QueRestore(&pTStack_18->pJust,local_4c,local_50);
            p_00 = pTStack_18;
            pGVar4 = Gia_Not(_hLearn0);
            Tas_ManAssign(p_00,pGVar4,pQue._4_4_ + 1,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
            iJustHead = Tas_ManSolve_rec(pTStack_18,pQue._4_4_ + 1);
            if (iJustHead == 0) {
              p_local._4_4_ = 0;
            }
            else {
              pGVar4 = *(Gia_Obj_t **)(*(long *)&pVar[1].field_0x4 + (long)iJustHead * 8);
              pGVar5 = Gia_Regular(_hLearn0);
              if (pGVar4 == pGVar5) {
                hLearn1 = Tas_ManResolve(pTStack_18,pQue._4_4_,iPropHead,iJustHead);
                Tas_ManCreateCls(pTStack_18,hLearn1);
                (pTStack_18->Pars).nBTThis = (pTStack_18->Pars).nBTThis + 1;
                p_local._4_4_ = hLearn1;
              }
              else {
                p_local._4_4_ = iJustHead;
              }
            }
          }
          else {
            p_local._4_4_ = iPropHead;
          }
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    Tas_ManCreateCls(pTStack_18,hLearn1);
    p_local._4_4_ = hLearn1;
  }
  return p_local._4_4_;
}

Assistant:

int Tas_ManSolve_rec( Tas_Man_t * p, int Level )
{ 
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar, * pDecVar = NULL;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Tas_QueIsEmpty(&p->pProp) );
    if ( (hClause = Tas_ManPropagate( p, Level )) )
    {
        Tas_ManCreateCls( p, hClause );
        return hClause;
    }
    // check for satisfying assignment
    assert( Tas_QueIsEmpty(&p->pProp) );
    if ( Tas_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Tas_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Tas_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseActive )
        pVar = NULL, pDecVar = Tas_ManFindActive( p );
    else if ( p->Pars.fUseHighest )
//        pVar = NULL, pDecVar = Tas_ManDecideHighestFanin( p );
        pVar = Tas_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Tas_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Tas_ManDecideMaxFF( p );
    else assert( 0 );
    // chose decision variable using fanout count
    if ( pVar != NULL )
    {
        assert( Tas_VarIsJust( pVar ) );
        if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
            pDecVar = Gia_Not(Gia_ObjChild0(pVar));
        else
            pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//        pDecVar = Gia_NotCond( pDecVar, Gia_Regular(pDecVar)->fMark1 ^ !Gia_IsComplement(pDecVar) );
    }
    // decide on first fanin
    Tas_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Tas_ManCancelUntil( p, iPropHead );
    Tas_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Tas_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Tas_ManResolve( p, Level, hLearn0, hLearn1 );
    Tas_ManCreateCls( p, hClause );
//    Tas_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Tas_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}